

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprocess.cpp
# Opt level: O3

void QProcess::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  Channel *pCVar3;
  bool bVar4;
  int iVar5;
  QProcessPrivate *this;
  long in_FS_OFFSET;
  undefined4 local_30;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == started && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == errorOccurred && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == stateChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == readyReadStandardOutput && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == readyReadStandardError && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    goto switchD_0041e198_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0041e198_default;
  switch(_id) {
  case 0:
    iVar5 = 0;
    break;
  case 1:
    local_2c = *_a[1];
    local_30 = *_a[2];
    goto LAB_0041e328;
  case 2:
    local_2c = *_a[1];
    local_30 = 0;
LAB_0041e328:
    local_18 = &local_30;
    iVar5 = 1;
    break;
  case 3:
    local_2c = *_a[1];
    iVar5 = 3;
    break;
  case 4:
    local_2c = *_a[1];
    local_18 = &local_30;
    iVar5 = 4;
    break;
  case 5:
    iVar5 = 5;
    break;
  case 6:
    iVar5 = 6;
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QProcessPrivate::terminateProcess((QProcessPrivate *)(_o->d_ptr).d);
      return;
    }
    goto LAB_0041e436;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QProcessPrivate::killProcess((QProcessPrivate *)(_o->d_ptr).d);
      return;
    }
    goto LAB_0041e436;
  case 9:
    this = (QProcessPrivate *)(_o->d_ptr).d;
    pCVar3 = &this->stdinChannel;
    goto LAB_0041e3c2;
  case 10:
    this = (QProcessPrivate *)(_o->d_ptr).d;
    pCVar3 = &this->stdoutChannel;
LAB_0041e3c2:
    bVar4 = QProcessPrivate::tryReadFromChannel(this,pCVar3 + 1);
    goto LAB_0041e3c7;
  case 0xb:
    bVar4 = QProcessPrivate::_q_canWrite((QProcessPrivate *)(_o->d_ptr).d);
    goto LAB_0041e3c7;
  case 0xc:
    bVar4 = QProcessPrivate::_q_startupNotification((QProcessPrivate *)(_o->d_ptr).d);
LAB_0041e3c7:
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar4;
    }
    goto switchD_0041e198_default;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QProcessPrivate::_q_processDied((QProcessPrivate *)(_o->d_ptr).d);
      return;
    }
    goto LAB_0041e436;
  default:
    goto switchD_0041e198_default;
  }
  local_20 = &local_2c;
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
switchD_0041e198_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0041e436:
  __stack_chk_fail();
}

Assistant:

void QProcess::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProcess *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QProcess::ExitStatus>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessError>>(_a[1]))); break;
        case 4: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessState>>(_a[1])), QPrivateSignal()); break;
        case 5: _t->readyReadStandardOutput(QPrivateSignal()); break;
        case 6: _t->readyReadStandardError(QPrivateSignal()); break;
        case 7: _t->terminate(); break;
        case 8: _t->kill(); break;
        case 9: { bool _r = _t->d_func()->_q_canReadStandardOutput();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 10: { bool _r = _t->d_func()->_q_canReadStandardError();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 11: { bool _r = _t->d_func()->_q_canWrite();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 12: { bool _r = _t->d_func()->_q_startupNotification();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: _t->d_func()->_q_processDied(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(int , QProcess::ExitStatus )>(_a, &QProcess::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessError )>(_a, &QProcess::errorOccurred, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessState , QPrivateSignal)>(_a, &QProcess::stateChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardOutput, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardError, 6))
            return;
    }
}